

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apngasm.cpp
# Opt level: O1

void __thiscall
apngasm::APNGAsm::process_rect
          (APNGAsm *this,uchar *row,int rowbytes,int bpp,int stride,int h,uchar *rows)

{
  uchar *puVar1;
  bool bVar2;
  uint uVar3;
  uInt uVar4;
  byte *pbVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  byte bVar11;
  uint uVar12;
  uint uVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  byte *pbVar17;
  byte *pbVar18;
  byte bVar19;
  long lVar20;
  uint uVar21;
  uint uVar22;
  uchar *__src;
  uchar *local_88;
  
  if (0 < h) {
    uVar4 = rowbytes + 1;
    lVar9 = (long)bpp;
    lVar20 = (long)rowbytes;
    uVar10 = (ulong)(uint)bpp;
    local_88 = rows;
    iVar7 = 0;
    pbVar5 = (byte *)0x0;
    do {
      __src = this->_row_buf;
      uVar6 = 0;
      if (0 < rowbytes) {
        uVar8 = 0;
        uVar6 = 0;
        do {
          bVar11 = row[uVar8];
          uVar12 = 0x100 - bVar11;
          if (-1 < (char)bVar11) {
            uVar12 = (uint)bVar11;
          }
          __src[uVar8 + 1] = bVar11;
          uVar6 = uVar6 + uVar12;
          uVar8 = uVar8 + 1;
        } while ((uint)rowbytes != uVar8);
      }
      puVar1 = this->_sub_row;
      if (bpp < 1) {
        uVar12 = 0;
      }
      else {
        uVar8 = 0;
        uVar12 = 0;
        do {
          bVar11 = row[uVar8];
          uVar13 = 0x100 - bVar11;
          if (-1 < (char)bVar11) {
            uVar13 = (uint)bVar11;
          }
          puVar1[uVar8 + 1] = bVar11;
          uVar12 = uVar12 + uVar13;
          uVar8 = uVar8 + 1;
        } while (uVar10 != uVar8);
      }
      if (bpp < rowbytes) {
        lVar14 = 1;
        pbVar17 = row;
        do {
          bVar11 = pbVar17[lVar9] - *pbVar17;
          puVar1[lVar14 + lVar9] = bVar11;
          uVar13 = 0x100 - bVar11;
          if (-1 < (char)bVar11) {
            uVar13 = (uint)bVar11;
          }
          uVar12 = uVar13 + uVar12;
          if (uVar6 < uVar12) break;
          lVar15 = lVar9 + lVar14;
          pbVar17 = pbVar17 + 1;
          lVar14 = lVar14 + 1;
        } while (lVar15 < lVar20);
      }
      if (uVar12 < uVar6) {
        __src = this->_sub_row;
        uVar6 = uVar12;
      }
      if (pbVar5 != (byte *)0x0) {
        if (rowbytes < 1) {
          uVar12 = 0;
        }
        else {
          puVar1 = this->_up_row;
          uVar12 = 0;
          lVar14 = 1;
          do {
            bVar11 = row[lVar14 + -1] - pbVar5[lVar14 + -1];
            puVar1[lVar14] = bVar11;
            uVar13 = 0x100 - bVar11;
            if (-1 < (char)bVar11) {
              uVar13 = (uint)bVar11;
            }
            uVar12 = uVar13 + uVar12;
          } while ((uVar12 <= uVar6) && (bVar2 = lVar14 < lVar20, lVar14 = lVar14 + 1, bVar2));
        }
        if (uVar12 < uVar6) {
          __src = this->_up_row;
          uVar6 = uVar12;
        }
        puVar1 = this->_avg_row;
        if (bpp < 1) {
          uVar12 = 0;
        }
        else {
          uVar8 = 0;
          uVar12 = 0;
          do {
            bVar11 = row[uVar8] - (pbVar5[uVar8] >> 1);
            uVar13 = 0x100 - bVar11;
            if (-1 < (char)bVar11) {
              uVar13 = (uint)bVar11;
            }
            puVar1[uVar8 + 1] = bVar11;
            uVar12 = uVar12 + uVar13;
            uVar8 = uVar8 + 1;
          } while (uVar10 != uVar8);
        }
        if (bpp < rowbytes) {
          lVar14 = 1;
          pbVar17 = pbVar5;
          pbVar18 = row;
          do {
            bVar11 = pbVar18[lVar9] - (char)((uint)*pbVar18 + (uint)pbVar17[lVar9] >> 1);
            puVar1[lVar14 + lVar9] = bVar11;
            uVar13 = 0x100 - bVar11;
            if (-1 < (char)bVar11) {
              uVar13 = (uint)bVar11;
            }
            uVar12 = uVar13 + uVar12;
            if (uVar6 < uVar12) break;
            lVar15 = lVar9 + lVar14;
            pbVar18 = pbVar18 + 1;
            pbVar17 = pbVar17 + 1;
            lVar14 = lVar14 + 1;
          } while (lVar15 < lVar20);
        }
        if (uVar12 < uVar6) {
          __src = this->_avg_row;
          uVar6 = uVar12;
        }
        puVar1 = this->_paeth_row;
        if (bpp < 1) {
          uVar12 = 0;
        }
        else {
          uVar8 = 0;
          uVar12 = 0;
          do {
            bVar11 = row[uVar8] - pbVar5[uVar8];
            uVar13 = 0x100 - bVar11;
            if (-1 < (char)bVar11) {
              uVar13 = (uint)bVar11;
            }
            puVar1[uVar8 + 1] = bVar11;
            uVar12 = uVar12 + uVar13;
            uVar8 = uVar8 + 1;
          } while (uVar10 != uVar8);
        }
        if (bpp < rowbytes) {
          lVar15 = 0;
          lVar14 = lVar9;
          do {
            lVar16 = lVar14 + 1;
            bVar11 = pbVar5[lVar15];
            uVar22 = (uint)pbVar5[lVar14] - (uint)bVar11;
            uVar21 = (uint)row[lVar15] - (uint)bVar11;
            uVar13 = -uVar22;
            if (0 < (int)uVar22) {
              uVar13 = uVar22;
            }
            uVar3 = -uVar21;
            if (0 < (int)uVar21) {
              uVar3 = uVar21;
            }
            uVar21 = uVar21 + uVar22;
            uVar22 = -uVar21;
            if (0 < (int)uVar21) {
              uVar22 = uVar21;
            }
            if ((uVar3 & 0xff) <= uVar22) {
              bVar11 = pbVar5[lVar14];
            }
            bVar19 = row[lVar15];
            if (uVar22 < (uVar13 & 0xff)) {
              bVar19 = bVar11;
            }
            if ((uVar3 & 0xff) < (uVar13 & 0xff)) {
              bVar19 = bVar11;
            }
            bVar19 = row[lVar14] - bVar19;
            puVar1[lVar16] = bVar19;
            uVar13 = 0x100 - bVar19;
            if (-1 < (char)bVar19) {
              uVar13 = (uint)bVar19;
            }
            uVar12 = uVar12 + uVar13;
          } while ((uVar12 <= uVar6) && (lVar15 = lVar15 + 1, lVar14 = lVar16, lVar16 < lVar20));
        }
        if (uVar12 < uVar6) {
          __src = this->_paeth_row;
        }
      }
      if (rows == (uchar *)0x0) {
        (this->_op_zstream1).next_in = this->_row_buf;
        (this->_op_zstream1).avail_in = uVar4;
        deflate(&this->_op_zstream1);
        (this->_op_zstream2).next_in = __src;
        (this->_op_zstream2).avail_in = uVar4;
        deflate();
      }
      else {
        memcpy(local_88,__src,(long)(int)uVar4);
        local_88 = local_88 + (int)uVar4;
      }
      iVar7 = iVar7 + 1;
      pbVar5 = row;
      row = row + stride;
    } while (iVar7 != h);
  }
  return;
}

Assistant:

void APNGAsm::process_rect(unsigned char * row, int rowbytes, int bpp, int stride, int h, unsigned char * rows)
  {
    int i, j, v;
    int a, b, c, pa, pb, pc, p;
    unsigned char * prev = NULL;
    unsigned char * dp  = rows;
    unsigned char * out;

    for (j=0; j<h; j++)
    {
      unsigned int    sum = 0;
      unsigned char * best_row = _row_buf;
      unsigned int    mins = ((unsigned int)(-1)) >> 1;

      out = _row_buf+1;
      for (i=0; i<rowbytes; i++)
      {
        v = out[i] = row[i];
        sum += (v < 128) ? v : 256 - v;
      }
      mins = sum;

      sum = 0;
      out = _sub_row+1;
      for (i=0; i<bpp; i++)
      {
        v = out[i] = row[i];
        sum += (v < 128) ? v : 256 - v;
      }
      for (i=bpp; i<rowbytes; i++)
      {
        v = out[i] = row[i] - row[i-bpp];
        sum += (v < 128) ? v : 256 - v;
        if (sum > mins) break;
      }
      if (sum < mins)
      {
        mins = sum;
        best_row = _sub_row;
      }

      if (prev)
      {
        sum = 0;
        out = _up_row+1;
        for (i=0; i<rowbytes; i++)
        {
          v = out[i] = row[i] - prev[i];
          sum += (v < 128) ? v : 256 - v;
          if (sum > mins) break;
        }
        if (sum < mins)
        {
          mins = sum;
          best_row = _up_row;
        }

        sum = 0;
        out = _avg_row+1;
        for (i=0; i<bpp; i++)
        {
          v = out[i] = row[i] - prev[i]/2;
          sum += (v < 128) ? v : 256 - v;
        }
        for (i=bpp; i<rowbytes; i++)
        {
          v = out[i] = row[i] - (prev[i] + row[i-bpp])/2;
          sum += (v < 128) ? v : 256 - v;
          if (sum > mins) break;
        }
        if (sum < mins)
        {
          mins = sum;
          best_row = _avg_row;
        }

        sum = 0;
        out = _paeth_row+1;
        for (i=0; i<bpp; i++)
        {
          v = out[i] = row[i] - prev[i];
          sum += (v < 128) ? v : 256 - v;
        }
        for (i=bpp; i<rowbytes; i++)
        {
          a = row[i-bpp];
          b = prev[i];
          c = prev[i-bpp];
          p = b - c;
          pc = a - c;
          pa = abs(p);
          pb = abs(pc);
          pc = abs(p + pc);
          p = (pa <= pb && pa <=pc) ? a : (pb <= pc) ? b : c;
          v = out[i] = row[i] - p;
          sum += (v < 128) ? v : 256 - v;
          if (sum > mins) break;
        }
        if (sum < mins)
        {
          best_row = _paeth_row;
        }
      }

      if (rows == NULL)
      {
        // deflate_rect_op()
        _op_zstream1.next_in = _row_buf;
        _op_zstream1.avail_in = rowbytes + 1;
        deflate(&_op_zstream1, Z_NO_FLUSH);

        _op_zstream2.next_in = best_row;
        _op_zstream2.avail_in = rowbytes + 1;
        deflate(&_op_zstream2, Z_NO_FLUSH);
      }
      else
      {
        // deflate_rect_fin()
        memcpy(dp, best_row, rowbytes+1);
        dp += rowbytes+1;
      }

      prev = row;
      row += stride;
    }
  }